

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * QByteArray::fromHex(QByteArray *__return_storage_ptr__,QByteArray *hexEncoded)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  qsizetype qVar5;
  byte *pbVar6;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray(__return_storage_ptr__,(hexEncoded->d).size + 1U >> 1,Uninitialized);
  pcVar3 = data(__return_storage_ptr__);
  pbVar6 = (byte *)(pcVar3 + (__return_storage_ptr__->d).size);
  qVar5 = (hexEncoded->d).size;
  do {
    bVar4 = true;
    while( true ) {
      do {
        if (qVar5 < 1) {
          remove(__return_storage_ptr__,(char *)0x0);
          return __return_storage_ptr__;
        }
        lVar1 = qVar5 + -1;
        qVar5 = qVar5 + -1;
        iVar2 = QtMiscUtils::fromHex((uint)(byte)(hexEncoded->d).ptr[lVar1]);
      } while (iVar2 == -1);
      if (!bVar4) break;
      pbVar6[-1] = (byte)iVar2;
      pbVar6 = pbVar6 + -1;
      bVar4 = false;
    }
    *pbVar6 = *pbVar6 | (byte)iVar2 << 4;
  } while( true );
}

Assistant:

QByteArray QByteArray::fromHex(const QByteArray &hexEncoded)
{
    QByteArray res((hexEncoded.size() + 1)/ 2, Qt::Uninitialized);
    uchar *result = (uchar *)res.data() + res.size();

    bool odd_digit = true;
    for (qsizetype i = hexEncoded.size() - 1; i >= 0; --i) {
        uchar ch = uchar(hexEncoded.at(i));
        int tmp = QtMiscUtils::fromHex(ch);
        if (tmp == -1)
            continue;
        if (odd_digit) {
            --result;
            *result = tmp;
            odd_digit = false;
        } else {
            *result |= tmp << 4;
            odd_digit = true;
        }
    }

    res.remove(0, result - (const uchar *)res.constData());
    return res;
}